

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# from_csr.hpp
# Opt level: O3

void run<unsigned_int,double,boost::container::flat_map<unsigned_int,double,std::less<unsigned_int>,void>>
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *A_rows,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *A_cols,
               vector<double,_std::allocator<double>_> *A_values,
               vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
               *B)

{
  uint uVar1;
  vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
  *pvVar2;
  vector<double,_std::allocator<double>_> *pvVar3;
  mapped_type *pmVar4;
  long lVar5;
  ulong uVar6;
  key_type local_64;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_60;
  vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
  *local_58;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_50;
  vector<double,_std::allocator<double>_> *local_48;
  long local_40;
  mapped_type local_38;
  
  lVar5 = (long)(A_rows->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(A_rows->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start >> 2;
  local_60 = A_rows;
  local_58 = B;
  local_50 = A_cols;
  local_48 = A_values;
  std::
  vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
  ::resize(B,lVar5 - 1);
  pvVar3 = local_48;
  pvVar2 = local_58;
  local_40 = lVar5 + -1;
  if (local_40 != 0) {
    lVar5 = 0;
    uVar6 = (ulong)*(local_60->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start;
    do {
      uVar1 = (local_60->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start[lVar5 + 1];
      if ((uint)uVar6 < uVar1) {
        do {
          local_38 = (pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start[uVar6];
          local_64 = (key_type)lVar5;
          pmVar4 = boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>::
                   priv_subscript((pvVar2->
                                  super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start +
                                  (local_50->
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                  _M_impl.super__Vector_impl_data._M_start[uVar6],&local_64);
          *pmVar4 = local_38;
          uVar6 = uVar6 + 1;
        } while (uVar1 != uVar6);
      }
      lVar5 = lVar5 + 1;
      uVar6 = (ulong)uVar1;
    } while (lVar5 != local_40);
  }
  do_nothing(local_58);
  return;
}

Assistant:

void run(std::vector<IndexT> const & A_rows, std::vector<IndexT> const & A_cols, std::vector<NumericT> const & A_values,
         std::vector<RowT> & B)
{
  std::size_t N = A_rows.size() - 1;
  B.resize(N);

  IndexT row_start = A_rows[0];
  for (std::size_t row = 0; row < N; ++row)
  {
    IndexT row_stop  = A_rows[row+1];

    for (IndexT nnz_index = row_start; nnz_index < row_stop; ++nnz_index)
      B[A_cols[nnz_index]][row] = A_values[nnz_index];

    row_start = row_stop;
  }

  do_nothing(B);
}